

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O3

void gflags::anon_unknown_5::Test_FlagSaverTest_CanSaveVariousTypedFlagValues::Run(void)

{
  int iVar1;
  undefined8 extraout_RAX;
  FlagSaver fs;
  FlagSaver fs_1;
  FlagSaver FStack_18;
  FlagSaver local_10;
  
  FlagSaver::FlagSaver(&FStack_18);
  fprintf(_stderr,"Running test %s/%s\n","FlagSaverTest","CanSaveVariousTypedFlagValues");
  fLB::FLAGS_test_bool = 0;
  fLI::FLAGS_test_int32 = 0xffffffff;
  fLU::FLAGS_test_uint32 = 2;
  fLI64::FLAGS_test_int64 = 0xfffffffffffffffd;
  fLU64::FLAGS_test_uint64 = 4;
  fLD::FLAGS_test_double = 5.0;
  std::__cxx11::string::_M_replace
            ((ulong)fLS::FLAGS_test_string_abi_cxx11_,0,
             *(char **)(fLS::FLAGS_test_string_abi_cxx11_ + 8),0x1502ab);
  FlagSaver::FlagSaver(&local_10);
  fLB::FLAGS_test_bool = '\x01';
  fLI::FLAGS_test_int32 = -5;
  fLU::FLAGS_test_uint32 = 6;
  fLI64::FLAGS_test_int64 = -7;
  fLU64::FLAGS_test_uint64 = 8;
  fLD::FLAGS_test_double = 8.0;
  std::__cxx11::string::_M_replace
            ((ulong)fLS::FLAGS_test_string_abi_cxx11_,0,
             *(char **)(fLS::FLAGS_test_string_abi_cxx11_ + 8),0x1502b0);
  FlagSaver::~FlagSaver(&local_10);
  if (fLB::FLAGS_test_bool == '\x01') {
    _GLOBAL__N_1::Test_FlagSaverTest_CanSaveVariousTypedFlagValues::Run();
LAB_00137972:
    _GLOBAL__N_1::Test_FlagSaverTest_CanSaveVariousTypedFlagValues::Run();
LAB_00137977:
    _GLOBAL__N_1::Test_FlagSaverTest_CanSaveVariousTypedFlagValues::Run();
LAB_0013797c:
    _GLOBAL__N_1::Test_FlagSaverTest_CanSaveVariousTypedFlagValues::Run();
LAB_00137981:
    _GLOBAL__N_1::Test_FlagSaverTest_CanSaveVariousTypedFlagValues::Run();
  }
  else {
    if (fLI::FLAGS_test_int32 != -1) goto LAB_00137972;
    if (fLU::FLAGS_test_uint32 != 2) goto LAB_00137977;
    if (fLI64::FLAGS_test_int64 != -3) goto LAB_0013797c;
    if (fLU64::FLAGS_test_uint64 != 4) goto LAB_00137981;
    if ((fLD::FLAGS_test_double + -0.001 <= 5.0) && (5.0 <= fLD::FLAGS_test_double + 0.001)) {
      iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_string_abi_cxx11_);
      if (iVar1 == 0) {
        FlagSaver::~FlagSaver(&FStack_18);
        return;
      }
      goto LAB_0013798b;
    }
  }
  _GLOBAL__N_1::Test_FlagSaverTest_CanSaveVariousTypedFlagValues::Run();
LAB_0013798b:
  _GLOBAL__N_1::Test_FlagSaverTest_CanSaveVariousTypedFlagValues::Run();
  FlagSaver::~FlagSaver(&local_10);
  FlagSaver::~FlagSaver(&FStack_18);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(FlagSaverTest, CanSaveVariousTypedFlagValues) {
  // Initializes the flags.
  FLAGS_test_bool = false;
  FLAGS_test_int32 = -1;
  FLAGS_test_uint32 = 2;
  FLAGS_test_int64 = -3;
  FLAGS_test_uint64 = 4;
  FLAGS_test_double = 5.0;
  FLAGS_test_string = "good";

  // Saves the flag states.
  {
    FlagSaver fs;

    // Modifies the flags.
    FLAGS_test_bool = true;
    FLAGS_test_int32 = -5;
    FLAGS_test_uint32 = 6;
    FLAGS_test_int64 = -7;
    FLAGS_test_uint64 = 8;
    FLAGS_test_double = 8.0;
    FLAGS_test_string = "bad";

    // Restores the flag states.
  }

  // Verifies the flag values were restored.
  EXPECT_FALSE(FLAGS_test_bool);
  EXPECT_EQ(-1, FLAGS_test_int32);
  EXPECT_EQ(2, FLAGS_test_uint32);
  EXPECT_EQ(-3, FLAGS_test_int64);
  EXPECT_EQ(4, FLAGS_test_uint64);
  EXPECT_DOUBLE_EQ(5.0, FLAGS_test_double);
  EXPECT_EQ("good", FLAGS_test_string);
}